

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterRender.cpp
# Opt level: O3

void * FilterRender::doAuto(void *data,uint width,uint height)

{
  undefined8 *puVar1;
  uint *puVar2;
  bool bVar3;
  ulong uVar4;
  int iVar5;
  void *pvVar6;
  void *pvVar7;
  void *pvVar8;
  void *pvVar9;
  void *pvVar10;
  void *pvVar11;
  int j_1;
  int iVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  int j;
  int iVar17;
  int iVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  undefined1 auVar24 [16];
  
  uVar23 = (ulong)height;
  pvVar6 = operator_new__(uVar23 * 8);
  pvVar7 = operator_new__(uVar23 * 4);
  pvVar8 = operator_new__(uVar23 * 4);
  pvVar9 = operator_new__(uVar23);
  if (height != 0) {
    uVar4 = (ulong)width;
    uVar22 = 0;
    do {
      pvVar10 = operator_new__(uVar4 * 8);
      *(void **)((long)pvVar6 + uVar22 * 8) = pvVar10;
      if (width != 0) {
        uVar21 = 0;
        do {
          pvVar11 = operator_new__(4);
          *(void **)((long)pvVar10 + uVar21 * 8) = pvVar11;
          uVar21 = uVar21 + 1;
        } while (uVar4 != uVar21);
      }
      uVar22 = uVar22 + 1;
    } while (uVar22 != uVar23);
    if (height != 0) {
      uVar22 = 0;
      pvVar10 = data;
      do {
        if (width != 0) {
          lVar19 = *(long *)((long)pvVar6 + uVar22 * 8);
          uVar21 = 0;
          do {
            lVar16 = 0;
            do {
              *(undefined1 *)(*(long *)(lVar19 + uVar21 * 8) + lVar16) =
                   *(undefined1 *)((long)pvVar10 + lVar16);
              lVar16 = lVar16 + 1;
            } while (lVar16 != 4);
            pvVar10 = (void *)((long)pvVar10 + 4);
            uVar21 = uVar21 + 1;
          } while (uVar21 != uVar4);
        }
        uVar22 = uVar22 + 1;
      } while (uVar22 != uVar23);
      if (height != 0) {
        iVar5 = width - 1;
        iVar12 = width - 6;
        uVar22 = 0;
LAB_00105ecd:
        *(undefined4 *)((long)pvVar7 + uVar22 * 4) = 0;
        *(uint *)((long)pvVar8 + uVar22 * 4) = width;
        puVar1 = *(undefined8 **)((long)pvVar6 + uVar22 * 8);
        puVar2 = (uint *)*puVar1;
        lVar19 = 0;
        do {
          auVar24 = psadbw(ZEXT416(*puVar2),ZEXT416(*(uint *)puVar1[lVar19]));
          if (0x1e < auVar24._0_4_) goto LAB_00105fb2;
          *(int *)((long)pvVar7 + uVar22 * 4) = (int)lVar19;
          lVar19 = lVar19 + 1;
        } while (lVar19 != 5);
        uVar21 = 4;
        iVar17 = 4;
        iVar15 = iVar12;
        iVar18 = iVar5;
        if ((ulong)(width - 5) != 0) {
          uVar20 = 0;
          do {
            iVar17 = (int)uVar21;
            auVar24 = psadbw(ZEXT416(*(uint *)puVar1[uVar20]),ZEXT416(*(uint *)puVar1[uVar20 + 5]));
            if (0x1e < auVar24._0_4_) goto joined_r0x00105f64;
            uVar21 = uVar20 & 0xffffffff;
            *(int *)((long)pvVar7 + uVar22 * 4) = (int)uVar20;
            uVar20 = uVar20 + 1;
          } while (width - 5 != uVar20);
          iVar17 = (int)uVar20 + -1;
        }
joined_r0x00105f64:
        do {
          if (iVar18 < iVar17) goto LAB_00105fb2;
          auVar24 = psadbw(ZEXT416(*(uint *)puVar1[iVar15 + 5]),ZEXT416(*(uint *)puVar1[iVar15]));
          if (0x1e < auVar24._0_4_) goto LAB_00105fb2;
          *(int *)((long)pvVar8 + uVar22 * 4) = iVar15 + 5;
          iVar18 = iVar15 + 4;
          iVar15 = iVar15 + -1;
        } while( true );
      }
    }
  }
  goto LAB_0010622d;
LAB_00105fb2:
  uVar22 = uVar22 + 1;
  if (uVar22 == uVar23) goto code_r0x00105fbe;
  goto LAB_00105ecd;
code_r0x00105fbe:
  if (height != 0) {
    uVar22 = 0;
    do {
      *(bool *)((long)pvVar9 + uVar22) =
           *(int *)((long)pvVar8 + uVar22 * 4) <= *(int *)((long)pvVar7 + uVar22 * 4);
      uVar22 = uVar22 + 1;
    } while (uVar23 != uVar22);
    if (height != 0) {
      uVar14 = 0;
      do {
        lVar16 = (long)(int)uVar14;
        iVar12 = *(int *)((long)pvVar7 + lVar16 * 4);
        lVar19 = lVar16;
        uVar13 = uVar14 + 1;
        if (uVar14 + 1 < height) {
          uVar13 = height;
        }
        do {
          if (*(char *)((long)pvVar9 + lVar19) != '\0') {
            uVar13 = (uint)lVar19;
            break;
          }
          iVar15 = *(int *)((long)pvVar7 + lVar19 * 4);
          if (iVar15 < iVar12) {
            iVar12 = iVar15;
          }
          lVar19 = lVar19 + 1;
        } while ((uint)lVar19 < height);
        if ((int)uVar14 < (int)uVar13) {
          do {
            if (*(char *)((long)pvVar9 + lVar16) == '\0') {
              *(int *)((long)pvVar7 + lVar16 * 4) = iVar12;
            }
            lVar16 = lVar16 + 1;
          } while ((int)uVar13 != lVar16);
        }
        uVar14 = uVar13 + 1;
      } while (uVar14 < height);
      if (height != 0) {
        uVar14 = 0;
        do {
          lVar16 = (long)(int)uVar14;
          iVar12 = *(int *)((long)pvVar8 + lVar16 * 4);
          lVar19 = lVar16;
          uVar13 = uVar14 + 1;
          if (uVar14 + 1 < height) {
            uVar13 = height;
          }
          do {
            if (*(char *)((long)pvVar9 + lVar19) != '\0') {
              uVar13 = (uint)lVar19;
              break;
            }
            iVar15 = *(int *)((long)pvVar8 + lVar19 * 4);
            if (iVar12 < iVar15) {
              iVar12 = iVar15;
            }
            lVar19 = lVar19 + 1;
          } while ((uint)lVar19 < height);
          if ((int)uVar14 < (int)uVar13) {
            do {
              if (*(char *)((long)pvVar9 + lVar16) == '\0') {
                *(int *)((long)pvVar8 + lVar16 * 4) = iVar12;
              }
              lVar16 = lVar16 + 1;
            } while ((int)uVar13 != lVar16);
          }
          uVar14 = uVar13 + 1;
        } while (uVar14 < height);
        if (height != 0) {
          uVar22 = 0;
          do {
            if (*(char *)((long)pvVar9 + uVar22) != '\x01') break;
            *(uint *)((long)pvVar7 + uVar22 * 4) = width;
            *(undefined4 *)((long)pvVar8 + uVar22 * 4) = 0;
            *(undefined1 *)((long)pvVar9 + uVar22) = 0;
            uVar22 = uVar22 + 1;
          } while (uVar23 != uVar22);
          if (-1 < (int)(height - 1)) {
            lVar19 = (ulong)(height - 1) + 1;
            do {
              if (*(char *)((long)pvVar9 + lVar19 + -1) != '\x01') break;
              *(uint *)((long)pvVar7 + lVar19 * 4 + -4) = width;
              *(undefined4 *)((long)pvVar8 + lVar19 * 4 + -4) = 0;
              *(undefined1 *)((long)pvVar9 + lVar19 + -1) = 0;
              lVar16 = lVar19 + -1;
              bVar3 = 0 < lVar19;
              lVar19 = lVar16;
            } while (lVar16 != 0 && bVar3);
          }
          if (height != 1) {
            uVar22 = 1;
            do {
              if (*(char *)((long)pvVar9 + uVar22) == '\x01') {
                *(undefined4 *)((long)pvVar7 + uVar22 * 4) =
                     *(undefined4 *)((long)pvVar7 + uVar22 * 4 + -4);
                *(undefined4 *)((long)pvVar8 + uVar22 * 4) =
                     *(undefined4 *)((long)pvVar8 + uVar22 * 4 + -4);
              }
              uVar22 = uVar22 + 1;
            } while (uVar23 != uVar22);
          }
          if (height != 0) {
            uVar22 = 0;
            do {
              uVar21 = (ulong)*(int *)((long)pvVar7 + uVar22 * 4);
              if (0 < (long)uVar21) {
                lVar19 = *(long *)((long)pvVar6 + uVar22 * 8);
                uVar20 = 0;
                do {
                  lVar16 = 0;
                  do {
                    *(undefined1 *)(*(long *)(lVar19 + uVar20 * 8) + lVar16) = 0xff;
                    lVar16 = lVar16 + 1;
                  } while (lVar16 != 4);
                  uVar20 = uVar20 + 1;
                } while (uVar20 < uVar21);
              }
              iVar12 = *(int *)((long)pvVar8 + uVar22 * 4);
              if (iVar12 <= iVar5) {
                lVar19 = *(long *)((long)pvVar6 + uVar22 * 8);
                iVar15 = iVar5;
                do {
                  lVar16 = 0;
                  do {
                    *(undefined1 *)(*(long *)(lVar19 + (long)iVar15 * 8) + lVar16) = 0;
                    lVar16 = lVar16 + 1;
                  } while (lVar16 != 4);
                  iVar15 = iVar15 + -1;
                } while (iVar12 <= iVar15);
              }
              uVar22 = uVar22 + 1;
            } while (uVar22 != uVar23);
            if (height != 0) {
              uVar22 = 0;
              do {
                if (width != 0) {
                  uVar21 = 0;
                  do {
                    lVar19 = 0;
                    do {
                      *(undefined1 *)((long)data + lVar19) =
                           *(undefined1 *)
                            (*(long *)(*(long *)((long)pvVar6 + uVar22 * 8) + uVar21 * 8) + lVar19);
                      lVar19 = lVar19 + 1;
                    } while (lVar19 != 4);
                    data = (void *)((long)data + 4);
                    uVar21 = uVar21 + 1;
                  } while (uVar21 != uVar4);
                }
                uVar22 = uVar22 + 1;
              } while (uVar22 != uVar23);
              operator_delete__(pvVar7);
            }
          }
        }
      }
    }
  }
LAB_0010622d:
  operator_delete__(pvVar7);
}

Assistant:

void* FilterRender::doAuto(void *data, uint width, uint height) {
	unsigned char ***map;
	int *le;
	int *ri;
	bool *all;

	map = new unsigned char**[height];
	le = new int[height];
	ri = new int[height];
	all = new bool[height];

	for (int i = 0; i < height; i++) {
		map[i] = new unsigned char*[width];
		for (int j = 0; j < width; j++) {
			map[i][j] = new unsigned char[4];
		}
	}

	unsigned char * p = (unsigned char*)data;

	for (int i = 0; i < height; i++) {
		for (int j = 0; j < width; j++) {
			for (int k = 0; k < 4; k++) {
				map[i][j][k] = *(p + k);
				// b g r a
			}
			p += 4;
		}
	}

	const int margin = 5;

	for (int i = 0; i < height; i++) {
		bool flag = true;
		le[i] = 0;
		ri[i] = width;
		for (int j = 0; j < margin; j++) {
			if (equal(map[i][0], map[i][j])) {
				le[i] = j;
			} else {
				flag = false;
				break;
			}
		}
		if (!flag) continue;
		for (int j = 0; j < width - margin; j++) {
			if (equal(map[i][j], map[i][j + margin])) {
				le[i] = j;
			} else {
				break;
			}
		}
		for (int j = width - 1; j >= le[i]; j--) {
			if (equal(map[i][j], map[i][j - margin])) {
				ri[i] = j;
			} else {
				break;
			}
		}
	}

	for (int i = 0; i < height; i++) {
		if (le[i] >= ri[i]) {
			all[i] = true;
		} else {
			all[i] = false;
		}
	}

	int i, j;
	for (i = 0; i < height; i = j + 1) {
		j = i;
		int common = le[i];
		for (; j < height; j ++) {
			if (all[j]) {
				break;
			}
			if (le[j] < common) {
				common = le[j];
			}
		}
		for (int k = i; k < j; k++) {
			if (all[k]) continue;
			le[k] = common;
		}
	}

	for (i = 0; i < height; i = j + 1) {
		j = i;
		int common = ri[i];
		for (; j < height; j ++) {
			if (all[j]) {
				break;
			}
			if (ri[j] > common) {
				common = ri[j];
			}
		}
		for (int k = i; k < j; k++) {
			if (all[k]) continue;
			ri[k] = common;
		}
	}

	for (int i = 0; i < height; i++) {
		if (!all[i]) break;
		le[i] = width;
		ri[i] = 0;
		all[i] = false;

	}

	for (int i = height - 1; i >= 0; i--) {
		if (!all[i]) break;
		le[i] = width;
		ri[i] = 0;
		all[i] = false;
	}

	for (int i = 1; i < height; i++) {
		if (all[i]) {
			le[i] = le[i - 1];
			ri[i] = ri[i - 1];
		}
	}

	for (int i = 0; i < height; i++) {
		for (int j = 0; j < le[i]; j++) {
			for (int k = 0; k < 4; k++) {
				map[i][j][k] = 255;
			}
		}
		for (int j = width - 1; j >= ri[i]; j--) {
			for (int k = 0; k < 4; k++) {
				map[i][j][k] = 0;
			}
		}
	}

	p = (unsigned char*)data;

	for (int i = 0; i < height; i++) {
		for (int j = 0; j < width; j++) {
			for (int k = 0; k < 4; k++) {
				*(p + k) = map[i][j][k];
			}
			p += 4;
		}
	}

	delete [] le;
	delete [] ri;
	delete [] all;

	for (int i = 0; i < height; i++) {
		for (int j = 0; j < width; j++) {
			delete [] map[i][j];
		}
		delete [] map[i];
	}
	delete [] map;
	map = NULL;
}